

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::TryGenerateFastBrOrCmTypeOf
          (Lowerer *this,Instr *instr,Instr **prev,bool isNeqOp,bool *pfNoLower)

{
  IRKind IVar1;
  Opnd *pOVar2;
  code *pcVar3;
  Type TVar4;
  bool bVar5;
  OpndKind OVar6;
  bool bVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  RegOpnd *pRVar10;
  AddrOpnd *pAVar11;
  JITJavascriptString *pJVar12;
  IntConstOpnd *typeIdOpnd;
  Instr *this_00;
  RegOpnd *pRVar13;
  StackSym *pSVar14;
  BranchInstr *pBVar15;
  Opnd *pOVar16;
  RegOpnd *this_01;
  uint uVar17;
  IntConstType value;
  Lowerer *this_02;
  RegOpnd *pRVar18;
  bool bVar19;
  undefined1 local_68 [8];
  InternalString typeNameString;
  
  typeNameString.m_content.ptr = (char16_t *)pfNoLower;
  if (prev == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6172,"(prev)","prev");
    if (!bVar5) goto LAB_005d3e31;
    *puVar8 = 0;
  }
  uVar17 = instr->m_opcode - 0xc;
  if (((0x36 < uVar17) || ((0x70800000000303U >> ((ulong)uVar17 & 0x3f) & 1) == 0)) &&
     (3 < instr->m_opcode - 0x194)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x617e,
                       "(instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar5) goto LAB_005d3e31;
    *puVar8 = 0;
  }
  pIVar9 = IR::Instr::GetPrevRealInstrOrLabel(instr);
  if (pIVar9 == (Instr *)0x0) {
    bVar5 = true;
    bVar19 = false;
    pIVar9 = (Instr *)0x0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar19 = pIVar9->m_opcode == Ld_A;
    if (bVar19) {
      do {
        OVar6 = IR::Opnd::GetKind(pIVar9->m_dst);
        if (OVar6 != OpndKindReg) {
          return false;
        }
        pOVar2 = pIVar9->m_dst;
        OVar6 = IR::Opnd::GetKind(pOVar2);
        if (OVar6 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_005d3e31;
          *puVar8 = 0;
        }
        if (((ushort)pOVar2[1].m_valueType.field_0 & 8) == 0) {
          return false;
        }
        if ((pIVar9->field_0x38 & 0x10) != 0) {
          return false;
        }
        pIVar9 = IR::Instr::GetPrevRealInstrOrLabel(pIVar9);
        bVar5 = pIVar9 == (Instr *)0x0;
        if (bVar5) {
          pIVar9 = (Instr *)0x0;
          break;
        }
      } while (pIVar9->m_opcode == Ld_A);
    }
    else {
      bVar5 = false;
    }
  }
  OVar6 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar6 == OpndKindReg) {
    pRVar13 = (RegOpnd *)instr->m_src1;
    OVar6 = IR::Opnd::GetKind((Opnd *)pRVar13);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_005d3e31;
      *puVar8 = 0;
    }
  }
  else {
    pRVar13 = (RegOpnd *)0x0;
  }
  OVar6 = IR::Opnd::GetKind(instr->m_src2);
  if (OVar6 == OpndKindReg) {
    this_01 = (RegOpnd *)instr->m_src2;
    OVar6 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_005d3e31;
      *puVar8 = 0;
    }
  }
  else {
    this_01 = (RegOpnd *)0x0;
  }
  if (((bVar5) || (pIVar9->m_opcode != Typeof)) ||
     (OVar6 = IR::Opnd::GetKind(pIVar9->m_dst), OVar6 != OpndKindReg)) {
LAB_005d3b9b:
    if (pRVar13 == (RegOpnd *)0x0) {
      return false;
    }
  }
  else {
    pOVar2 = pIVar9->m_dst;
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_005d3e31;
      *puVar8 = 0;
    }
    if (this_01 == (RegOpnd *)0x0 || pRVar13 == (RegOpnd *)0x0) goto LAB_005d3b9b;
    pRVar10 = pRVar13;
    pRVar18 = this_01;
    if (((pRVar13->m_sym == (StackSym *)pOVar2[1]._vptr_Opnd) ||
        (pRVar10 = this_01, pRVar18 = pRVar13, this_01->m_sym == (StackSym *)pOVar2[1]._vptr_Opnd))
       && ((pRVar10->field_0x18 & 1) != 0)) {
      if ((~*(uint *)&pRVar18->m_sym->field_0x18 & 0x401) != 0) {
        return false;
      }
      OVar6 = IR::Opnd::GetKind(((pRVar18->m_sym->field_5).m_instrDef)->m_src1);
      if (OVar6 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x61c1,"(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd())",
                           "idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd()");
        if (!bVar5) goto LAB_005d3e31;
        *puVar8 = 0;
      }
      pAVar11 = IR::Opnd::AsAddrOpnd(((pRVar18->m_sym->field_5).m_instrDef)->m_src1);
      pJVar12 = JITJavascriptString::FromVar(pAVar11->m_localAddress);
      value = 0;
      Js::InternalString::InternalString
                ((InternalString *)local_68,pJVar12->m_pszValue,pJVar12->m_charLength,'\0');
      bVar5 = Js::InternalStringComparer::Equals
                        ((InternalString *)local_68,
                         (InternalString *)Js::Type::UndefinedTypeNameString);
      if (!bVar5) {
        bVar5 = Js::InternalStringComparer::Equals
                          ((InternalString *)local_68,
                           (InternalString *)Js::Type::ObjectTypeNameString);
        value = 0x1c;
        if (!bVar5) {
          bVar5 = Js::InternalStringComparer::Equals
                            ((InternalString *)local_68,
                             (InternalString *)Js::Type::BooleanTypeNameString);
          value = 2;
          if (!bVar5) {
            bVar5 = Js::InternalStringComparer::Equals
                              ((InternalString *)local_68,
                               (InternalString *)Js::Type::NumberTypeNameString);
            value = 4;
            if (!bVar5) {
              bVar5 = Js::InternalStringComparer::Equals
                                ((InternalString *)local_68,
                                 (InternalString *)Js::Type::StringTypeNameString);
              value = 7;
              if (!bVar5) {
                bVar5 = Js::InternalStringComparer::Equals
                                  ((InternalString *)local_68,
                                   (InternalString *)Js::Type::FunctionTypeNameString);
                value = 0x1b;
                if (!bVar5) {
                  return false;
                }
              }
            }
          }
        }
      }
      typeIdOpnd = IR::IntConstOpnd::New(value,TyInt32,instr->m_func,false);
      if (bVar19) {
        pOVar16 = pIVar9->m_src1;
        for (this_00 = IR::Instr::GetNextRealInstr(pIVar9); this_00 != instr;
            this_00 = IR::Instr::GetNextRealInstr(this_00)) {
          bVar5 = IR::Opnd::IsEqual(this_00->m_dst,pOVar2);
          if (bVar5) {
            return false;
          }
          bVar5 = IR::Opnd::IsEqual(this_00->m_dst,pOVar16);
          if (bVar5) {
            return false;
          }
        }
        IR::Instr::Unlink(pIVar9);
        IR::Instr::InsertBefore(instr,pIVar9);
      }
      pOVar2 = pIVar9->m_src1;
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x61f7,"(objectOpnd->IsRegOpnd())","objectOpnd->IsRegOpnd()");
        if (!bVar5) {
LAB_005d3e31:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      TVar4.ptr = typeNameString.m_content.ptr;
      *prev = pIVar9->m_prev;
      *(undefined1 *)typeNameString.m_content.ptr = 0;
      IVar1 = instr->m_kind;
      pRVar13 = IR::Opnd::AsRegOpnd(pOVar2);
      if (IVar1 == InstrKindBranch) {
        GenerateFastBrTypeOf(this,instr,pRVar13,typeIdOpnd,pIVar9,(bool *)TVar4.ptr,isNeqOp);
        return true;
      }
      GenerateFastCmTypeOf(this,instr,pRVar13,typeIdOpnd,pIVar9,(bool *)TVar4.ptr,isNeqOp);
      return true;
    }
  }
  pSVar14 = IR::Opnd::GetStackSym(&pRVar13->super_Opnd);
  TVar4 = typeNameString.m_content;
  if (this_01 == (RegOpnd *)0x0) {
    return false;
  }
  if ((*(uint *)&pSVar14->field_0x18 & 1) == 0) {
    return false;
  }
  if ((pSVar14->field_5).m_instrDef == (Instr *)0x0) {
    return false;
  }
  pSVar14 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
  if ((pSVar14->field_0x18 & 1) == 0) {
    return false;
  }
  if ((pSVar14->field_5).m_instrDef == (Instr *)0x0) {
    return false;
  }
  pSVar14 = IR::Opnd::GetStackSym(&pRVar13->super_Opnd);
  if ((pSVar14->field_0x18 & 1) == 0) {
    pIVar9 = (Instr *)0x0;
  }
  else {
    pIVar9 = (pSVar14->field_5).m_instrDef;
  }
  if (pIVar9->m_opcode == Typeof) {
    pSVar14 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
    if ((pSVar14->field_0x18 & 1) == 0) {
      pIVar9 = (Instr *)0x0;
    }
    else {
      pIVar9 = (pSVar14->field_5).m_instrDef;
    }
    if (pIVar9->m_opcode == Typeof) goto LAB_005d3c98;
    pSVar14 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
    bVar5 = StackSym::GetIsStrConst(pSVar14);
    if (bVar5) goto LAB_005d3c98;
  }
  pSVar14 = IR::Opnd::GetStackSym(&this_01->super_Opnd);
  if ((pSVar14->field_0x18 & 1) == 0) {
    pIVar9 = (Instr *)0x0;
  }
  else {
    pIVar9 = (pSVar14->field_5).m_instrDef;
  }
  if (pIVar9->m_opcode != Typeof) {
    return false;
  }
  pSVar14 = IR::Opnd::GetStackSym(&pRVar13->super_Opnd);
  if ((pSVar14->field_0x18 & 1) == 0) {
    pIVar9 = (Instr *)0x0;
  }
  else {
    pIVar9 = (pSVar14->field_5).m_instrDef;
  }
  if (pIVar9->m_opcode != Typeof) {
    pSVar14 = IR::Opnd::GetStackSym(&pRVar13->super_Opnd);
    bVar5 = StackSym::GetIsStrConst(pSVar14);
    if (!bVar5) {
      return false;
    }
  }
LAB_005d3c98:
  *(undefined1 *)TVar4.ptr = 1;
  if (instr->m_kind == InstrKindBranch) {
    this_02 = (Lowerer *)instr;
    pBVar15 = IR::Instr::AsBranchInstr(instr);
    InsertCompareBranch(this_02,&pRVar13->super_Opnd,&this_01->super_Opnd,isNeqOp | BrEq_A,false,
                        pBVar15->m_branchTarget,instr,false);
  }
  else {
    bVar5 = IR::Opnd::IsEqual(&pRVar13->super_Opnd,&this_01->super_Opnd);
    pOVar2 = instr->m_dst;
    if (bVar5) {
      pOVar16 = LoadLibraryValueOpnd(this,instr,isNeqOp + ValueTrue);
      InsertMove(pOVar2,pOVar16,instr,true);
    }
    else {
      bVar5 = IR::Opnd::IsEqual(pOVar2,&pRVar13->super_Opnd);
      if (bVar5) {
        pIVar9 = IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,(StackSym *)0x0);
        pIVar9 = LowererMD::ChangeToAssign(pIVar9);
        pRVar13 = IR::Opnd::AsRegOpnd(pIVar9->m_dst);
      }
      bVar5 = IR::Opnd::IsEqual(instr->m_dst,&this_01->super_Opnd);
      if (bVar5) {
        pIVar9 = IR::Instr::HoistSrc2(instr,Ld_A,RegNOREG,(StackSym *)0x0);
        pIVar9 = LowererMD::ChangeToAssign(pIVar9);
        this_01 = IR::Opnd::AsRegOpnd(pIVar9->m_dst);
      }
      pOVar2 = instr->m_dst;
      pOVar16 = LoadLibraryValueOpnd(this,instr,ValueTrue);
      InsertMove(pOVar2,pOVar16,instr,true);
      InsertCompare(&pRVar13->super_Opnd,&this_01->super_Opnd,instr);
      pOVar2 = instr->m_dst;
      pOVar16 = LoadLibraryValueOpnd(this,instr,ValueFalse);
      LowererMD::InsertCmovCC
                ((ushort)!isNeqOp + (ushort)!isNeqOp * 4 + CMOVE,pOVar2,pOVar16,instr,false);
    }
  }
  IR::Instr::Remove(instr);
  return true;
}

Assistant:

bool
Lowerer::TryGenerateFastBrOrCmTypeOf(IR::Instr *instr, IR::Instr **prev, bool isNeqOp, bool *pfNoLower)
{
    Assert(prev);
    Assert(instr->m_opcode == Js::OpCode::BrSrEq_A     ||
           instr->m_opcode == Js::OpCode::BrSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrSrNotEq_A  ||
           instr->m_opcode == Js::OpCode::BrSrNotNeq_A ||
           instr->m_opcode == Js::OpCode::CmSrEq_A     ||
           instr->m_opcode == Js::OpCode::CmSrNeq_A    ||
           instr->m_opcode == Js::OpCode::BrEq_A       ||
           instr->m_opcode == Js::OpCode::BrNeq_A      ||
           instr->m_opcode == Js::OpCode::BrNotEq_A    ||
           instr->m_opcode == Js::OpCode::BrNotNeq_A   ||
           instr->m_opcode == Js::OpCode::CmEq_A       ||
           instr->m_opcode == Js::OpCode::CmNeq_A);

    //
    // instr         - (Br/Cm)(Sr)(N(ot))eq_A
    // instr->m_prev - typeOf
    //
    IR::Instr *instrLd = instr->GetPrevRealInstrOrLabel();
    bool skippedLoads = false;
    //Skip intermediate Ld_A which might be inserted by flow graph peeps
    while (instrLd && instrLd->m_opcode == Js::OpCode::Ld_A )
    {
        if (!(instrLd->GetDst()->IsRegOpnd() && instrLd->GetDst()->AsRegOpnd()->m_fgPeepTmp))
        {
            return false;
        }
        if (instrLd->HasBailOutInfo())
        {
            return false;
        }
        instrLd = instrLd->GetPrevRealInstrOrLabel();
        skippedLoads = true;
    }

    IR::Instr *typeOf = instrLd;

    IR::RegOpnd *instrSrc1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *instrSrc2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;
    if (typeOf && (typeOf->m_opcode == Js::OpCode::Typeof))
    {
        IR::RegOpnd *typeOfDst = typeOf->GetDst()->IsRegOpnd() ? typeOf->GetDst()->AsRegOpnd() : nullptr;

        if (typeOfDst && instrSrc1 && instrSrc2)
        {
            do
            {
                IR::RegOpnd *typeOpnd = nullptr;
                IR::RegOpnd *idOpnd = nullptr;
                if (instrSrc1->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc1;
                    idOpnd = instrSrc2;
                }
                else if (instrSrc2->m_sym == typeOfDst->m_sym)
                {
                    typeOpnd = instrSrc2;
                    idOpnd = instrSrc1;
                }
                else
                {
                    // Neither source turned out to be the typeOpnd
                    break;
                }

                if (!typeOpnd->m_isTempLastUse)
                {
                    break;
                }

                if (!(idOpnd->m_sym->m_isSingleDef && idOpnd->m_sym->m_isStrConst))
                {
                    return false;
                }

                // The second argument to [Cm|Br]TypeOf is the typeid.
                IR::IntConstOpnd *typeIdOpnd = nullptr;

                Assert(idOpnd->m_sym->m_isSingleDef);
                Assert(idOpnd->m_sym->m_instrDef->GetSrc1()->IsAddrOpnd());

                // We can't optimize non-javascript type strings.
                JITJavascriptString *typeNameJsString = JITJavascriptString::FromVar(idOpnd->m_sym->m_instrDef->GetSrc1()->AsAddrOpnd()->m_localAddress);
                const char16        *typeName = typeNameJsString->GetString();

                Js::InternalString typeNameString(typeName, typeNameJsString->GetLength());
                if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::UndefinedTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Undefined, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::ObjectTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Object, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::BooleanTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Boolean, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::NumberTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::StringTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_String, TyInt32, instr->m_func);
                }
                else if (Js::InternalStringComparer::Equals(typeNameString, Js::Type::FunctionTypeNameString))
                {
                    typeIdOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, instr->m_func);
                }
                else
                {
                    return false;
                }

                if (skippedLoads)
                {
                    //validate none of dst of Ld_A overlaps with typeof src or dst
                    IR::Opnd* typeOfSrc = typeOf->GetSrc1();
                    instrLd = typeOf->GetNextRealInstr();
                    while (instrLd != instr)
                    {
                        if (instrLd->GetDst()->IsEqual(typeOfDst) || instrLd->GetDst()->IsEqual(typeOfSrc))
                        {
                            return false;
                        }
                        instrLd = instrLd->GetNextRealInstr();
                    }
                    typeOf->Unlink();
                    instr->InsertBefore(typeOf);
                }
                // The first argument to [Cm|Br]TypeOf is the first arg to the TypeOf instruction.
                IR::Opnd *objectOpnd = typeOf->GetSrc1();
                Assert(objectOpnd->IsRegOpnd());

                // Now emit this instruction and remove the ldstr and typeOf.
                *prev = typeOf->m_prev;
                *pfNoLower = false;
                if (instr->IsBranchInstr())
                {
                    GenerateFastBrTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }
                else
                {
                    GenerateFastCmTypeOf(instr, objectOpnd->AsRegOpnd(), typeIdOpnd, typeOf, pfNoLower, isNeqOp);
                }

                return true;
            } while (false);
        }
    }

    if (instrSrc1 && instrSrc1->GetStackSym()->IsSingleDef() && instrSrc2 && instrSrc2->GetStackSym()->IsSingleDef() &&
        (
            ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc2->GetStackSym()->GetIsStrConst()))
            ||
            ((instrSrc2->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) &&
                ((instrSrc1->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::Typeof) || instrSrc1->GetStackSym()->GetIsStrConst()))
            )
        )
    {
        *pfNoLower = true;
        if (instr->IsBranchInstr())
        {
            InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, instr->AsBranchInstr()->GetTarget(), instr);
            instr->Remove();
        }
        else
        {
            if (instrSrc1->IsEqual(instrSrc2))
            {
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, isNeqOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue), instr);
            }
            else
            {
                // t1 = typeof o1
                // t2 = typeof o2
                // dst = t1 == t2

                // MOV dst, true
                // CMP t1, t2

                // x86, amd64
                // CMOVNE dst, false

                // arm
                // BEQ $done
                // MOV dst, false
                // $done

                if (instr->GetDst()->IsEqual(instrSrc1))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
                    instrSrc1 = hoistInstr->GetDst()->AsRegOpnd();
                }
                if (instr->GetDst()->IsEqual(instrSrc2))
                {
                    IR::Instr* hoistInstr = m_lowererMD.ChangeToAssign(instr->HoistSrc2(Js::OpCode::Ld_A));
                    instrSrc2 = hoistInstr->GetDst()->AsRegOpnd();
                }

                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), instr);

#if defined(_M_ARM32_OR_ARM64)
                IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
                InsertCompareBranch(instrSrc1, instrSrc2, isNeqOp ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, doneLabel, instr);
                InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
                instr->InsertBefore(doneLabel);
#else
                InsertCompare(instrSrc1, instrSrc2, instr);
                LowererMD::InsertCmovCC(isNeqOp ? Js::OpCode::CMOVE : Js::OpCode::CMOVNE, instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), instr);
#endif
            }
            instr->Remove();
        }
        return true;
    }

    return false;
}